

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool do_vfp_3op_dp(DisasContext_conflict1 *s,VFPGen3OpDPFn_conflict *fn,int vd,int vn,int vm,
                   _Bool reads_vd)

{
  uint uVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  uint uVar3;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  TCGTemp *pTVar4;
  TCGv_i64 ret;
  uint uVar5;
  int iVar6;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xf00) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar6 = s->vec_len;
    if ((((uVar1 & 0xe) != 0) || (((vn | vd | vm) & 0x10U) == 0)) &&
       (((uVar1 & 0xf000000) != 0 || ((iVar6 == 0 && (s->vec_stride == 0)))))) {
      _Var2 = full_vfp_access_check(s,false);
      if (!_Var2) {
        return true;
      }
      if (iVar6 < 1) {
        uVar5 = 0;
        uVar1 = 0;
      }
      else if ((vd & 0xcU) == 0) {
        uVar5 = 0;
        iVar6 = 0;
        uVar1 = 0;
      }
      else {
        uVar5 = (s->vec_stride >> 1) + 1;
        uVar1 = vm & 0xcU;
        if ((vm & 0xcU) != 0) {
          uVar1 = uVar5;
        }
      }
      a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      a1_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      a1_01 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar4 - (long)s_00);
      tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)vn >> 1) * 0x100 + (ulong)(vn & 1) * 8 + 0xc10);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)vm >> 1) * 0x100 + (ulong)(vm & 1) * 8 + 0xc10);
      do {
        iVar6 = -iVar6;
        do {
          if (reads_vd) {
            tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1_01,
                                (TCGArg)(s_00->cpu_env + (long)s_00),
                                (ulong)((uint)vd >> 1) * 0x100 + (ulong)(vd & 1) * 8 + 0xc10);
          }
          (*fn)(s_00,(TCGv_i64)((long)a1_01 - (long)s_00),(TCGv_i64)((long)a1 - (long)s_00),
                (TCGv_i64)((long)a1_00 - (long)s_00),(TCGv_ptr)ret);
          tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)a1_01,
                              (TCGArg)(s_00->cpu_env + (long)s_00),
                              (ulong)((uint)vd >> 1) * 0x100 + (ulong)(vd & 1) * 8 + 0xc10);
          iVar6 = iVar6 + 1;
          if (iVar6 == 1) {
            tcg_temp_free_internal_aarch64
                      (s_00,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s_00) + (long)s_00));
            tcg_temp_free_internal_aarch64
                      (s_00,(TCGTemp *)((TCGv_i64)((long)a1_00 - (long)s_00) + (long)s_00));
            tcg_temp_free_internal_aarch64
                      (s_00,(TCGTemp *)((TCGv_i64)((long)a1_01 - (long)s_00) + (long)s_00));
            tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
            return true;
          }
          vd = vd & 0xfffffffcU | uVar5 + vd & 3;
          uVar3 = vn + uVar5;
          vn = vn & 0xfffffffcU | uVar3 & 3;
          tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                              (ulong)((uint)vn >> 1) * 0x100 + (ulong)(uVar3 & 1) * 8 + 0xc10);
        } while (uVar1 == 0);
        uVar3 = uVar1 + vm;
        vm = vm & 0xfffffffcU | uVar3 & 3;
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)((uint)vm >> 1) * 0x100 + (ulong)(uVar3 & 1) * 8 + 0xc10);
        iVar6 = -iVar6;
      } while( true );
    }
  }
  return false;
}

Assistant:

static bool do_vfp_3op_dp(DisasContext *s, VFPGen3OpDPFn *fn,
                          int vd, int vn, int vm, bool reads_vd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 f0, f1, fd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((vd | vn | vm) & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;

            if (vfp_dreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i64(tcg_ctx);
    f1 = tcg_temp_new_i64(tcg_ctx);
    fd = tcg_temp_new_i64(tcg_ctx);
    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    neon_load_reg64(tcg_ctx, f0, vn);
    neon_load_reg64(tcg_ctx, f1, vm);

    for (;;) {
        if (reads_vd) {
            neon_load_reg64(tcg_ctx, fd, vd);
        }
        fn(tcg_ctx, fd, f0, f1, fpst);
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }
        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
        vn = vfp_advance_dreg(vn, delta_d);
        neon_load_reg64(tcg_ctx, f0, vn);
        if (delta_m) {
            vm = vfp_advance_dreg(vm, delta_m);
            neon_load_reg64(tcg_ctx, f1, vm);
        }
    }

    tcg_temp_free_i64(tcg_ctx, f0);
    tcg_temp_free_i64(tcg_ctx, f1);
    tcg_temp_free_i64(tcg_ctx, fd);
    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}